

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::UncoreMinimize::pushTrim(UncoreMinimize *this,Solver *s)

{
  uint32 uVar1;
  uint32 uVar2;
  size_type sVar3;
  OptParams OVar4;
  uint64 uVar5;
  PostPropagator *this_00;
  
  uVar1 = this->aTop_;
  Todo::shrinkPush(&this->todo_,this,s);
  uVar2 = (s->levels_).root;
  this->aTop_ = uVar2;
  sVar3 = (s->conflict_).ebo_.size;
  if (sVar3 == 0 && uVar2 != uVar1) {
    OVar4 = this->options_;
    if (((uint)OVar4 & 0x1f000) != 0) {
      this_00 = (PostPropagator *)operator_new(0x20);
      uVar5 = (s->stats).super_CoreStats.conflicts;
      PostPropagator::PostPropagator(this_00);
      (this_00->super_Constraint)._vptr_Constraint = (_func_int **)&PTR_propagate_001e8e70;
      this_00[1].super_Constraint._vptr_Constraint = (_func_int **)this;
      this_00[1].next = (PostPropagator *)(uVar5 + (1L << ((byte)((uint)OVar4 >> 0xc) & 0x1f)));
      Solver::addPost(s,this_00);
      Solver::addUndoWatch(s,this->aTop_,(Constraint *)this_00);
    }
  }
  else if (((sVar3 != 0) && ((((s->conflict_).ebo_.buf)->rep_ ^ 2) < 2)) &&
          ((this->conflict_).ebo_.size == 2)) {
    this->lower_ = this->lower_ - (long)(this->todo_).minW_;
    (this->todo_).lits_.ebo_.size = 0;
    (this->todo_).core_.ebo_.size = 0;
    (this->todo_).minW_ = 0x7fffffff;
    (this->todo_).last_ = 0;
    (this->todo_).next_ = 0;
    (this->todo_).step_ = 0;
    Solver::clearStopConflict(s);
    (this->conflict_).ebo_.size = 0;
    popPath(this,s,0);
    pushPath(this,s);
  }
  return (s->conflict_).ebo_.size == 0;
}

Assistant:

bool UncoreMinimize::pushTrim(Solver& s) {
	assert(!s.hasConflict() && s.rootLevel() == aTop_ && conflict_.empty());
	uint32 top = aTop_;
	todo_.shrinkPush(*this, s);
	if ((aTop_ = s.rootLevel()) != top && !s.hasConflict() && options_.tLim) {
		struct Limit : public PostPropagator {
			Limit(UncoreMinimize& s, uint64 lim) : self(&s), limit(lim) {}
			uint32 priority() const { return priority_reserved_ufs + 2; }
			bool propagateFixpoint(Clasp::Solver& s, Clasp::PostPropagator* ctx) {
				if (ctx || s.stats.conflicts < limit) { return true; }
				s.setStopConflict();
				self->next_ = 1;
				self = 0;
				s.removePost(this);
				return false;
			}
			void undoLevel(Solver& s) {
				if (self) { s.removePost(this); }
				this->destroy();
			}
			UncoreMinimize* self;
			uint64 limit;
		}*limit = new Limit(*this, s.stats.conflicts + (uint64(1) << options_.tLim));
		s.addPost(limit);
		s.addUndoWatch(aTop_, limit);
	}
	else if (s.hasStopConflict() && conflict_.size() == 2) {
		assert(getData(conflict_[1].rep()).assume);
		lower_ -= todo_.weight();
		todo_.clear(true);
		s.clearStopConflict();
		conflict_.clear();
		popPath(s, 0);
		pushPath(s);
	}
	return !s.hasConflict();
}